

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space_mixer.c
# Opt level: O2

void calculate_pitch_shift(space_source *source,space_mixer_data *listener)

{
  undefined1 auVar1 [16];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  
  fVar5 = listener->doppler_factor;
  if (fVar5 <= 0.0) {
    fVar5 = 1.0;
  }
  else {
    fVar2 = listener->location[0] - source->location[0];
    fVar3 = listener->location[1] - source->location[1];
    fVar4 = listener->location[2] - source->location[2];
    fVar6 = listener->soundspeed;
    auVar7 = ZEXT416((uint)(fVar4 * fVar4 + fVar2 * fVar2 + fVar3 * fVar3));
    auVar1 = vsqrtss_avx(auVar7,auVar7);
    auVar7 = vminss_avx(ZEXT416((uint)(auVar1._0_4_ *
                                      (fVar4 * source->velocity[2] +
                                      fVar2 * source->velocity[0] + fVar3 * source->velocity[1]))),
                        ZEXT416((uint)(fVar6 / fVar5)));
    auVar1 = vminss_avx(ZEXT416((uint)(auVar1._0_4_ *
                                      (fVar4 * listener->velocity[2] +
                                      fVar2 * listener->velocity[0] + fVar3 * listener->velocity[1])
                                      )),ZEXT416((uint)(fVar6 / fVar5)));
    fVar6 = (fVar6 - fVar5 * auVar1._0_4_) / (fVar6 - fVar5 * auVar7._0_4_);
    fVar5 = 0.5;
    if ((0.5 <= fVar6) && (fVar5 = 2.0, fVar6 < 2.0)) {
      fVar5 = fVar6;
    }
  }
  source->pitch = fVar5;
  return;
}

Assistant:

VECTORIZE static void calculate_pitch_shift(struct space_source *source, struct space_mixer_data *listener){
  if(listener->doppler_factor <= 0.0){
    source->pitch = 1.0;
    return;
  }
  // See OpenAL1.1 specification §3.5.2
  float SL[3] = {listener->location[0] - source->location[0],
                 listener->location[1] - source->location[1],
                 listener->location[2] - source->location[2]};
  float *SV = source->velocity;
  float *LV = listener->velocity;
  float SS = listener->soundspeed;
  float DF = listener->doppler_factor;
  float Mag = vec_length(SL);
  float vls = vec_dot(SL, LV) * Mag;
  float vss = vec_dot(SL, SV) * Mag;
  float SS_DF = SS/DF;
  vss = MIN(vss, SS_DF);
  vls = MIN(vls, SS_DF);
  float pitch = CLAMP(0.5, (SS - DF*vls) / (SS - DF*vss), 2.0);
  source->pitch = pitch;
}